

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::PortBundleRef> __thiscall
kratos::Generator::get_bundle_ref(Generator *this,string *port_name)

{
  bool bVar1;
  UserException *this_00;
  mapped_type *pmVar2;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::PortBundleRef> sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  key_type *local_20;
  string *port_name_local;
  Generator *this_local;
  
  local_20 = in_RDX;
  port_name_local = port_name;
  this_local = this;
  bVar1 = has_port_bundle((Generator *)port_name,in_RDX);
  if (!bVar1) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    std::operator+(&local_60,local_20," not found in ");
    std::operator+(&local_40,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&port_name[3].field_2 + 8));
    UserException::UserException(this_00,&local_40);
    __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
                 *)&port_name[0xe]._M_string_length,local_20);
  std::shared_ptr<kratos::PortBundleRef>::shared_ptr
            ((shared_ptr<kratos::PortBundleRef> *)this,pmVar2);
  sVar3.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::PortBundleRef>)
         sVar3.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PortBundleRef> Generator::get_bundle_ref(const std::string &port_name) {
    if (!has_port_bundle(port_name)) {
        throw UserException(port_name + " not found in " + name);
    }
    return port_bundle_mapping_.at(port_name);
}